

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseGTMCoverage.cxx
# Opt level: O2

bool __thiscall
cmParseGTMCoverage::FindFunctionInMumpsFile
          (cmParseGTMCoverage *this,string *filepath,string *function,int *lineoffset)

{
  byte bVar1;
  cmCTest *this_00;
  bool bVar2;
  long lVar3;
  ostream *poVar4;
  int iVar5;
  string line;
  char *local_3d0 [4];
  ostringstream cmCTestLog_msg;
  ifstream in;
  byte abStack_218 [488];
  
  std::ifstream::ifstream(&in,(filepath->_M_dataplus)._M_p,_S_in);
  iVar5 = 0;
  bVar2 = false;
  if ((abStack_218[*(long *)(_in + -0x18)] & 5) == 0) {
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    while (bVar2 = cmsys::SystemTools::GetLineFromStream((istream *)&in,&line,(bool *)0x0,-1), bVar2
          ) {
      lVar3 = std::__cxx11::string::find((string *)&line,(ulong)function);
      if (lVar3 == 1) {
        if ((*line._M_dataplus._M_p == '%') &&
           ((line._M_dataplus._M_p[function->_M_string_length + 1] & 0xf7U) == 0x20)) {
          *lineoffset = iVar5;
          goto LAB_0016f11c;
        }
      }
      else if (lVar3 == 0) {
        bVar1 = line._M_dataplus._M_p[function->_M_string_length];
        if (((ulong)bVar1 < 0x29) && ((0x10100000200U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
          *lineoffset = iVar5;
          if ((bVar1 < 0x29) && ((0x10100000200U >> ((ulong)(uint)bVar1 & 0x3f) & 1) != 0))
          goto LAB_0016f11c;
        }
      }
      iVar5 = iVar5 + 1;
    }
    *lineoffset = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar4 = std::operator<<((ostream *)&cmCTestLog_msg,"Could not find entry point : ");
    poVar4 = std::operator<<(poVar4,(string *)function);
    poVar4 = std::operator<<(poVar4," in ");
    poVar4 = std::operator<<(poVar4,(string *)filepath);
    std::operator<<(poVar4,"\n");
    this_00 = (this->super_cmParseMumpsCoverage).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(this_00,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmParseGTMCoverage.cxx"
                 ,0x9d,local_3d0[0],false);
    std::__cxx11::string::~string((string *)local_3d0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
LAB_0016f11c:
    std::__cxx11::string::~string((string *)&line);
  }
  std::ifstream::~ifstream(&in);
  return bVar2;
}

Assistant:

bool cmParseGTMCoverage::FindFunctionInMumpsFile(std::string const& filepath,
                                                 std::string const& function,
                                                 int& lineoffset)
{
  cmsys::ifstream in(filepath.c_str());
  if (!in) {
    return false;
  }
  std::string line;
  int linenum = 0;
  while (cmSystemTools::GetLineFromStream(in, line)) {
    std::string::size_type pos = line.find(function);
    if (pos == 0) {
      char nextchar = line[function.size()];
      if (nextchar == ' ' || nextchar == '(' || nextchar == '\t') {
        lineoffset = linenum;
        return true;
      }
    }
    if (pos == 1) {
      char prevchar = line[0];
      char nextchar = line[function.size() + 1];
      if (prevchar == '%' && (nextchar == ' ' || nextchar == '(')) {
        lineoffset = linenum;
        return true;
      }
    }
    linenum++; // move to next line count
  }
  lineoffset = 0;
  cmCTestLog(this->CTest, ERROR_MESSAGE,
             "Could not find entry point : " << function << " in " << filepath
                                             << "\n");
  return false;
}